

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

wstring * cfgfile::
          format_t<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_cfgfile::string_trait_t>
          ::from_string(parser_info_t<cfgfile::string_trait_t> *param_1,string_t *value)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  wstring *in_RDI;
  wstring *res;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  
  uVar1 = 0;
  std::__cxx11::wstring::wstring((wstring *)in_RDI);
  std::__cxx11::string::cbegin();
  std::__cxx11::string::cend();
  std::__cxx11::wstring::assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             CONCAT17(uVar1,in_stack_ffffffffffffffe0),in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

static std::wstring from_string( const parser_info_t< string_trait_t > &,
		const string_trait_t::string_t & value )
	{
		std::wstring res;
		res.assign( value.cbegin(), value.cend() );

		return res;
	}